

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
jbcoin::SerialIter::getRawHelper<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          SerialIter *this,int size)

{
  ulong __n;
  allocator_type local_19;
  
  __n = (ulong)size;
  if (__n <= this->remain_) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,__n,&local_19);
    memcpy((__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start,this->p_,__n);
    this->p_ = this->p_ + __n;
    this->used_ = this->used_ + __n;
    this->remain_ = this->remain_ - __n;
    return __return_storage_ptr__;
  }
  Throw<std::runtime_error,char_const(&)[26]>((char (*) [26])"invalid SerialIter getRaw");
}

Assistant:

T SerialIter::getRawHelper (int size)
{
    static_assert(std::is_same<T, Blob>::value ||
                  std::is_same<T, Buffer>::value, "");
    if (remain_ < size)
        Throw<std::runtime_error> (
            "invalid SerialIter getRaw");
    T result (size);
    memcpy(result.data (), p_, size);
    p_ += size;
    used_ += size;
    remain_ -= size;
    return result;
}